

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O3

void capnp::_::WireHelpers::transferPointer
               (SegmentBuilder *dstSegment,WirePointer *dst,SegmentBuilder *srcSegment,
               WirePointer *src)

{
  uint uVar1;
  
  uVar1 = (src->offsetAndKind).value;
  if ((src->field_1).upper32Bits == 0 && uVar1 == 0) {
    dst->offsetAndKind = 0;
    dst->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    return;
  }
  if ((uVar1 & 2) == 0) {
    transferPointer(dstSegment,dst,srcSegment,src,(word *)(src + (long)((int)uVar1 >> 2) + 1));
    return;
  }
  *dst = *src;
  return;
}

Assistant:

KJ_ALWAYS_INLINE(T get() const) { return value; }